

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.hpp
# Opt level: O0

char getch(void)

{
  int iVar1;
  ssize_t sVar2;
  undefined1 local_48 [8];
  termios old;
  char buf;
  
  old.c_ispeed._3_1_ = '\0';
  memset(local_48,0,0x3c);
  fflush(_stdout);
  iVar1 = tcgetattr(0,(termios *)local_48);
  if (iVar1 < 0) {
    perror("tcsetattr()");
  }
  old.c_oflag = old.c_oflag & 0xfffffff5;
  old.c_lflag._3_1_ = 1;
  old.c_lflag._2_1_ = 0;
  iVar1 = tcsetattr(0,0,(termios *)local_48);
  if (iVar1 < 0) {
    perror("tcsetattr ICANON");
  }
  sVar2 = read(0,(void *)((long)&old.c_ispeed + 3),1);
  if (sVar2 < 0) {
    perror("read()");
  }
  old.c_oflag = old.c_oflag | 10;
  iVar1 = tcsetattr(0,1,(termios *)local_48);
  if (iVar1 < 0) {
    perror("tcsetattr ~ICANON");
  }
  return old.c_ispeed._3_1_;
}

Assistant:

char getch() {
    char buf = 0;
    struct termios old = {0};
    fflush(stdout);
    if (tcgetattr(0, &old) < 0)
        perror("tcsetattr()");
    old.c_lflag &= ~ICANON; // local modes = Non Canonical mode
    old.c_lflag &= ~ECHO; // local modes = Disable echo.
    old.c_cc[VMIN] = 1; // control chars (MIN value) = 1
    old.c_cc[VTIME] = 0; // control chars (TIME value) = 0 (No time)
    if (tcsetattr(0, TCSANOW, &old) < 0)
        perror("tcsetattr ICANON");
    if (read(0, &buf, 1) < 0)
        perror("read()");
    old.c_lflag |= ICANON; // local modes = Canonical mode
    old.c_lflag |= ECHO; // local modes = Enable echo.
    if (tcsetattr(0, TCSADRAIN, &old) < 0)
        perror("tcsetattr ~ICANON");
    return buf;
}